

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefaultSkewItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultSkewItemSyntax,slang::syntax::DefaultSkewItemSyntax_const&>
          (BumpAllocator *this,DefaultSkewItemSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  DefaultSkewItemSyntax *pDVar13;
  
  pDVar13 = (DefaultSkewItemSyntax *)allocate(this,0x78,8);
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pDVar13->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar13->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pDVar13->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  (pDVar13->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4
  ;
  (pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00b668a8;
  (pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pDVar13->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pDVar13->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pDVar13->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00b667e8;
  (pDVar13->semi).info = (args->semi).info;
  TVar9 = (args->keyword).kind;
  uVar10 = (args->keyword).field_0x2;
  NVar11.raw = (args->keyword).numFlags.raw;
  uVar12 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  TVar5 = (args->semi).kind;
  uVar6 = (args->semi).field_0x2;
  NVar7.raw = (args->semi).numFlags.raw;
  uVar8 = (args->semi).rawLen;
  (pDVar13->direction).ptr = (args->direction).ptr;
  (pDVar13->semi).kind = TVar5;
  (pDVar13->semi).field_0x2 = uVar6;
  (pDVar13->semi).numFlags = (NumericTokenFlags)NVar7.raw;
  (pDVar13->semi).rawLen = uVar8;
  (pDVar13->keyword).kind = TVar9;
  (pDVar13->keyword).field_0x2 = uVar10;
  (pDVar13->keyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (pDVar13->keyword).rawLen = uVar12;
  (pDVar13->keyword).info = pIVar3;
  return pDVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }